

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1a1edb::PeerManagerImpl::PackageToValidate::PackageToValidate
          (PackageToValidate *this,CTransactionRef *parent,CTransactionRef *child,
          NodeId parent_sender,NodeId child_sender)

{
  initializer_list<std::shared_ptr<const_CTransaction>_> __l;
  initializer_list<long> __l_00;
  size_type in_RDI;
  allocator_type *__a;
  long in_FS_OFFSET;
  allocator<long> *in_stack_fffffffffffffef8;
  allocator_type *in_stack_ffffffffffffff30;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *in_stack_ffffffffffffff38;
  allocator_type *this_00;
  iterator in_stack_ffffffffffffff40;
  allocator_type *paVar1;
  allocator_type local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffffef8,
             (shared_ptr<const_CTransaction> *)0x2d15bc);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffffef8,
             (shared_ptr<const_CTransaction> *)0x2d15d1);
  std::allocator<std::shared_ptr<const_CTransaction>_>::allocator
            ((allocator<std::shared_ptr<const_CTransaction>_> *)in_stack_fffffffffffffef8);
  __l._M_len = in_RDI;
  __l._M_array = in_stack_ffffffffffffff40;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(in_stack_ffffffffffffff38,__l,in_stack_ffffffffffffff30);
  std::allocator<std::shared_ptr<const_CTransaction>_>::~allocator
            ((allocator<std::shared_ptr<const_CTransaction>_> *)in_stack_fffffffffffffef8);
  this_00 = local_28;
  __a = (allocator_type *)&local_8;
  do {
    __a = __a + -0x10;
    std::shared_ptr<const_CTransaction>::~shared_ptr
              ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffffef8);
  } while (__a != this_00);
  paVar1 = __a;
  std::allocator<long>::allocator(in_stack_fffffffffffffef8);
  __l_00._M_len = in_RDI;
  __l_00._M_array = (iterator)paVar1;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)this_00,__l_00,__a);
  std::allocator<long>::~allocator(in_stack_fffffffffffffef8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit PackageToValidate(const CTransactionRef& parent,
                                   const CTransactionRef& child,
                                   NodeId parent_sender,
                                   NodeId child_sender) :
            m_txns{parent, child},
            m_senders {parent_sender, child_sender}
        {}